

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O3

long __thiscall FString::IndexOf(FString *this,char subchar,long startIndex)

{
  char *pcVar1;
  ulong uVar2;
  char *pcVar3;
  
  pcVar1 = this->Chars;
  if ((startIndex < 1) ||
     (uVar2 = 0xffffffffffffffff, (ulong)startIndex < (ulong)*(uint *)(pcVar1 + -0xc))) {
    pcVar3 = strchr(pcVar1 + startIndex,(int)subchar);
    uVar2 = -(ulong)(pcVar3 == (char *)0x0) | (long)pcVar3 - (long)pcVar1;
  }
  return uVar2;
}

Assistant:

long FString::IndexOf (char subchar, long startIndex) const
{
	if (startIndex > 0 && Len() <= (size_t)startIndex)
	{
		return -1;
	}
	char *str = strchr (Chars + startIndex, subchar);
	if (str == NULL)
	{
		return -1;
	}
	return long(str - Chars);
}